

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::EndEmitFunction(ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc)

{
  OpCode OVar1;
  FuncInfo *pFVar2;
  Scope *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  FuncInfo *pFVar7;
  
  OVar1 = (pnodeFnc->super_ParseNode).nop;
  if ((OVar1 | knopInt) != knopProg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf82,"(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg)",
                       "pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg");
    if (!bVar5) goto LAB_00808b24;
    *puVar6 = 0;
    OVar1 = (pnodeFnc->super_ParseNode).nop;
  }
  if ((OVar1 != knopProg) &&
     ((OVar1 != knopFncDecl || (this->currentScope->enclosingScope == (Scope *)0x0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf83,
                       "(pnodeFnc->nop == knopFncDecl && currentScope->GetEnclosingScope() != nullptr || pnodeFnc->nop == knopProg)"
                       ,
                       "pnodeFnc->nop == knopFncDecl && currentScope->GetEnclosingScope() != nullptr || pnodeFnc->nop == knopProg"
                      );
    if (!bVar5) goto LAB_00808b24;
    *puVar6 = 0;
  }
  PopScope(this);
  pFVar2 = pnodeFnc->funcInfo;
  if ((pFVar2->field_0xb5 & 0x80) == 0) {
    if (this->currentScope != pFVar2->paramScope) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf8c,"(this->GetCurrentScope() == paramScope)",
                         "this->GetCurrentScope() == paramScope");
      if (!bVar5) goto LAB_00808b24;
      *puVar6 = 0;
    }
    PopScope(this);
  }
  bVar5 = Js::ParseableFunctionInfo::IsFunctionParsed(pFVar2->byteCodeFunction);
  if ((((bVar5) && (pFVar2->root->pnodeBody != (ParseNodePtr)0x0)) &&
      (pSVar3 = pFVar2->funcExprScope, pSVar3 != (Scope *)0x0)) &&
     ((pSVar3->field_0x44 & 0x10) != 0)) {
    if (this->currentScope != pSVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf97,"(currentScope == scope)","currentScope == scope");
      if (!bVar5) goto LAB_00808b24;
      *puVar6 = 0;
    }
    PopScope(this);
  }
  pFVar7 = TopFuncInfo(this);
  if (pFVar2 != pFVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf9c,"(funcInfo == this->TopFuncInfo())","funcInfo == this->TopFuncInfo()")
    ;
    if (!bVar5) {
LAB_00808b24:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  PopFuncInfo(this,L"EndEmitFunction");
  return;
}

Assistant:

void ByteCodeGenerator::EndEmitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg);
    Assert(pnodeFnc->nop == knopFncDecl && currentScope->GetEnclosingScope() != nullptr || pnodeFnc->nop == knopProg);

    PopScope(); // function body

    FuncInfo *funcInfo = pnodeFnc->funcInfo;

    Scope* paramScope = funcInfo->paramScope;
    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        Assert(this->GetCurrentScope() == paramScope);
        PopScope(); // Pop the param scope
    }

    if (funcInfo->byteCodeFunction->IsFunctionParsed() && funcInfo->root->pnodeBody != nullptr)
    {
        // StartEmitFunction omits the matching PushScope for already-parsed functions.
        // TODO: Refactor Start and EndEmitFunction for clarity.
        Scope *scope = funcInfo->funcExprScope;
        if (scope && scope->GetMustInstantiate())
        {
            Assert(currentScope == scope);
            PopScope();
        }
    }

    Assert(funcInfo == this->TopFuncInfo());
    PopFuncInfo(_u("EndEmitFunction"));
}